

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.h
# Opt level: O2

Vec3 cert::trace(Ray *r,World *world,int depth)

{
  int depth_00;
  HitRecord *__return_storage_ptr__;
  float fVar1;
  float fVar2;
  Vec3 VVar3;
  Vec3 VVar4;
  Vec3 VVar5;
  HitRecord rec;
  ScatterOut out;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  HitRecord local_98;
  char local_64 [12];
  float local_58;
  Ray local_54;
  float local_3c;
  Ray local_38;
  
  __return_storage_ptr__ = &local_98;
  World::hit(__return_storage_ptr__,world,r,0.001,3.4028235e+38);
  if (local_98.hit == true) {
    if (depth < 6) {
      VVar4.z = local_98.p.z;
      VVar4.x = local_98.p.x;
      VVar4.y = local_98.p.y;
      VVar5.z = local_98.normal.z;
      VVar5.x = local_98.normal.x;
      VVar5.y = local_98.normal.y;
      VVar4 = World::light_hit(world,VVar4,VVar5);
      (*(local_98.mat)->_vptr_Material[2])
                (local_98.p.x,local_98.p.z,local_98.normal._0_8_,local_98.normal.z,local_98.uv,
                 local_64,local_98.mat,r,world);
      if (local_3c < 0.0) {
        local_b8 = VVar4.x;
        fStack_b4 = VVar4.y;
        local_b8 = local_b8 * (float)local_64._4_8_;
        fStack_b4 = fStack_b4 * SUB84(local_64._4_8_,4);
        fVar1 = VVar4.z * local_58;
        if (local_64[0] == '\x01') {
          VVar4 = trace(&local_54,world,depth + 1);
          local_b8 = local_b8 * VVar4.x;
          fStack_b4 = fStack_b4 * VVar4.y;
          fVar1 = fVar1 * VVar4.z;
        }
      }
      else {
        depth_00 = depth + 1;
        if (local_3c < 1.0) {
          VVar4 = trace(&local_54,world,depth_00);
          VVar5 = trace(&local_38,world,depth_00);
          fVar2 = 1.0 - local_3c;
          fVar1 = VVar5.z * fVar2 + VVar4.z * local_3c;
          local_a8 = VVar4.x;
          fStack_a4 = VVar4.y;
          local_b8 = fVar2 * VVar5.x + local_3c * local_a8;
          fStack_b4 = fVar2 * VVar5.y + local_3c * fStack_a4;
        }
        else {
          VVar4 = trace(&local_38,world,depth_00);
          fVar1 = VVar4.z;
          local_b8 = VVar4.x;
          fStack_b4 = VVar4.y;
        }
      }
    }
    else {
      fVar1 = 0.0;
      local_b8 = 0.0;
      fStack_b4 = 0.0;
    }
  }
  else {
    VVar4 = background_color((cert *)__return_storage_ptr__,r->direction);
    fVar1 = VVar4.z;
    local_b8 = VVar4.x;
    fStack_b4 = VVar4.y;
  }
  VVar3.y = fStack_b4;
  VVar3.x = local_b8;
  VVar3.z = fVar1;
  return VVar3;
}

Assistant:

constexpr Vec3 trace (const Ray& r, World& world, int depth)
{
	HitRecord rec = world.hit (r, 0.001, std::numeric_limits<float>::max ());
	if (rec.hit)
	{
		if (depth > max_bounces) return VEC3_ZERO;

		auto light_contribution = world.light_hit (rec.p, rec.normal);

		ScatterOut out = rec.mat->scatter (rec.p, rec.normal, rec.uv, r, world.random);
		if (out.index >= 0.0f)
		{
			if (out.index >= 1.0f)
			{
				return trace (out.refracted, world, depth + 1);
			}
			else
			{
				Vec3 reflect_contrib = trace (out.scattered, world, depth + 1);
				Vec3 refract_contrib = trace (out.refracted, world, depth + 1);
				return out.index * reflect_contrib + (1.0 - out.index) * refract_contrib;
			}
		}
		else if (out.is_scattered)
		{
			return light_contribution * out.attenuation * trace (out.scattered, world, depth + 1);
		}
		else
		{
			return light_contribution * out.attenuation;
		}
	}
	else
	{
		return background_color (r.direction);
	}
}